

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int32_t __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::PointerMap::Find
          (PointerMap *this,void *ptr)

{
  uint32_t uVar1;
  uintptr_t uVar2;
  uint32_t *puVar3;
  Node **ppNVar4;
  Node *n;
  int32_t i;
  uintptr_t masked;
  void *ptr_local;
  PointerMap *this_local;
  
  uVar2 = base_internal::HidePtr<void>(ptr);
  uVar1 = Hash(ptr);
  puVar3 = (uint32_t *)std::array<int,_262139UL>::operator[](&this->table_,(ulong)uVar1);
  n._4_4_ = *puVar3;
  while( true ) {
    if (n._4_4_ == 0xffffffff) {
      return -1;
    }
    ppNVar4 = Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[](this->nodes_,n._4_4_);
    if ((*ppNVar4)->masked_ptr == uVar2) break;
    n._4_4_ = (*ppNVar4)->next_hash;
  }
  return n._4_4_;
}

Assistant:

int32_t Find(void* ptr) {
    auto masked = base_internal::HidePtr(ptr);
    for (int32_t i = table_[Hash(ptr)]; i != -1;) {
      Node* n = (*nodes_)[static_cast<uint32_t>(i)];
      if (n->masked_ptr == masked) return i;
      i = n->next_hash;
    }
    return -1;
  }